

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_lib.cpp
# Opt level: O0

int waitIDE(lua_State *L)

{
  int iVar1;
  EmmyFacade *this;
  lua_Number lVar2;
  undefined4 local_18;
  int timeout;
  int top;
  lua_State *L_local;
  
  iVar1 = (*lua_gettop)(L);
  local_18 = 0;
  if (0 < iVar1) {
    lVar2 = (*luaL_checknumber)(L,1);
    local_18 = (int)lVar2;
  }
  this = EmmyFacade::Get();
  EmmyFacade::WaitIDE(this,false,local_18);
  return 0;
}

Assistant:

int waitIDE(lua_State* L)
{
	int top = lua_gettop(L);
	int timeout = 0;
	if (top >= 1)
	{
		timeout = static_cast<int>(luaL_checknumber(L, 1));
	}
	EmmyFacade::Get().WaitIDE(false, timeout);
	return 0;
}